

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoSimdUnop<float,float>(Thread *this,UnopFunc<float,_float> *f)

{
  float *__first;
  float *__last;
  float *__result;
  Simd<float,_(unsigned_char)__x04_> SVar1;
  float afStack_38 [2];
  SR result;
  Simd<float,_(unsigned_char)__x04_> val;
  UnopFunc<float,_float> *f_local;
  Thread *this_local;
  
  SVar1 = Pop<wabt::interp::Simd<float,(unsigned_char)4>>(this);
  result.v._8_8_ = SVar1.v._0_8_;
  __first = std::begin<float,4ul>((float (*) [4])(result.v + 2));
  __last = std::end<float,4ul>((float (*) [4])(result.v + 2));
  __result = std::begin<float,4ul>((float (*) [4])afStack_38);
  std::transform<float*,float*,float(*)(float)>(__first,__last,__result,f);
  SVar1.v[2] = result.v[0];
  SVar1.v[3] = result.v[1];
  SVar1.v[0] = afStack_38[0];
  SVar1.v[1] = afStack_38[1];
  Push<wabt::interp::Simd<float,(unsigned_char)4>>(this,SVar1);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdUnop(UnopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  auto val = Pop<ST>();
  SR result;
  std::transform(std::begin(val.v), std::end(val.v), std::begin(result.v), f);
  Push(result);
  return RunResult::Ok;
}